

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

real __thiscall
fasttext::Model::computeLoss
          (Model *this,vector<int,_std::allocator<int>_> *targets,int32_t targetIndex,real lr)

{
  element_type *peVar1;
  invalid_argument *this_00;
  int in_EDX;
  Model *in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  real in_XMM0_Da;
  real loss;
  undefined8 in_stack_ffffffffffffffc0;
  real lr_00;
  Model *in_stack_ffffffffffffffd0;
  real local_1c;
  
  lr_00 = (real)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
  peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x17b005);
  if (peVar1->loss == ns) {
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)in_RSI,(long)in_EDX);
    local_1c = negativeSampling(in_stack_ffffffffffffffd0,(int32_t)((ulong)in_RDI >> 0x20),
                                SUB84(in_RDI,0));
  }
  else {
    peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x17b048);
    if (peVar1->loss == hs) {
      std::vector<int,_std::allocator<int>_>::operator[]
                ((vector<int,_std::allocator<int>_> *)in_RSI,(long)in_EDX);
      local_1c = hierarchicalSoftmax(in_RSI,in_EDX,in_XMM0_Da);
    }
    else {
      peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x17b08b);
      if (peVar1->loss == softmax) {
        std::vector<int,_std::allocator<int>_>::operator[]
                  ((vector<int,_std::allocator<int>_> *)in_RSI,(long)in_EDX);
        local_1c = softmax(in_RSI,in_EDX,in_XMM0_Da);
      }
      else {
        peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x17b0ce);
        if (peVar1->loss != ova) {
          this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument(this_00,"Unhandled loss function for this model.")
          ;
          __cxa_throw(this_00,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        local_1c = oneVsAll(in_stack_ffffffffffffffd0,in_RDI,lr_00);
      }
    }
  }
  return local_1c;
}

Assistant:

real Model::computeLoss(
		const std::vector<int32_t>& targets,
		int32_t targetIndex,
		real lr) {
	real loss = 0.0;

	if (args_->loss == loss_name::ns) {
		loss = negativeSampling(targets[targetIndex], lr);
	} else if (args_->loss == loss_name::hs) {
		loss = hierarchicalSoftmax(targets[targetIndex], lr);
	} else if (args_->loss == loss_name::softmax) {
		loss = softmax(targets[targetIndex], lr);
	} else if (args_->loss == loss_name::ova) {
		loss = oneVsAll(targets, lr);
	} else {
		throw std::invalid_argument("Unhandled loss function for this model.");
	}

	return loss;
}